

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall zstr::Exception::Exception(Exception *this,z_stream *zstrm_p,int ret)

{
  string *in_RDI;
  int in_stack_00000334;
  z_stream *in_stack_00000338;
  string local_38 [56];
  
  error_to_message_abi_cxx11_(in_stack_00000338,in_stack_00000334);
  std::ios_base::failure[abi:cxx11]::failure(in_RDI);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)in_RDI = &PTR__Exception_0096d3c8;
  return;
}

Assistant:

Exception(z_stream* zstrm_p, int ret)
      : std::ios_base::failure(error_to_message(zstrm_p, ret)) {}